

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# async.c++
# Opt level: O2

void __thiscall kj::_::Event::armLast(Event *this)

{
  EventLoop *pEVar1;
  EventLoop *pEVar2;
  Event **ppEVar3;
  long in_FS_OFFSET;
  bool _kjCondition;
  Fault f;
  
  pEVar1 = this->loop;
  pEVar2 = *(EventLoop **)(in_FS_OFFSET + -0x28);
  _kjCondition = pEVar2 == (EventLoop *)0x0 || pEVar2 == pEVar1;
  if (pEVar2 != (EventLoop *)0x0 && pEVar2 != pEVar1) {
    Debug::Fault::Fault<kj::Exception::Type,bool&,char_const(&)[111]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
               ,0x8c2,FAILED,"threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr",
               "_kjCondition,\"Event armed from different thread than it was created in.  You must use \" \"Executor to queue events cross-thread.\""
               ,&_kjCondition,
               (char (*) [111])
               "Event armed from different thread than it was created in.  You must use Executor to queue events cross-thread."
              );
    Debug::Fault::fatal(&f);
  }
  if (this->live == 0x1e366381) {
    if (this->prev != (Event **)0x0) {
      return;
    }
    ppEVar3 = pEVar1->breadthFirstInsertPoint;
    this->next = *ppEVar3;
    this->prev = ppEVar3;
    *ppEVar3 = this;
    if (this->next != (Event *)0x0) {
      this->next->prev = &this->next;
    }
    pEVar1 = this->loop;
    if (pEVar1->tail == this->prev) {
      pEVar1->tail = &this->next;
    }
    EventLoop::setRunnable(pEVar1,true);
    return;
  }
  Debug::Fault::Fault<kj::Exception::Type,char_const(&)[42],kj::SourceLocation&>
            (&f,
             "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/async.c++"
             ,0x8c5,FAILED,(char *)0x0,"\"tried to arm Event after it was destroyed\", location",
             (char (*) [42])"tried to arm Event after it was destroyed",&this->location);
  Debug::Fault::fatal(&f);
}

Assistant:

void Event::armLast() {
  KJ_REQUIRE(threadLocalEventLoop == &loop || threadLocalEventLoop == nullptr,
             "Event armed from different thread than it was created in.  You must use "
             "Executor to queue events cross-thread.");
  if (live != MAGIC_LIVE_VALUE) {
    ([this]() noexcept {
      KJ_FAIL_ASSERT("tried to arm Event after it was destroyed", location);
    })();
  }

  if (prev == nullptr) {
    next = *loop.breadthFirstInsertPoint;
    prev = loop.breadthFirstInsertPoint;
    *prev = this;
    if (next != nullptr) {
      next->prev = &next;
    }

    // We don't update loop.breadthFirstInsertPoint because we want further inserts to go *before*
    // this event.

    if (loop.tail == prev) {
      loop.tail = &next;
    }

    loop.setRunnable(true);
  }
}